

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrandom.cpp
# Opt level: O2

qsizetype QRandomGenerator::SystemGenerator::fillBuffer(void *buffer,qsizetype count)

{
  qsizetype qVar1;
  
  for (qVar1 = count; 0x100 < qVar1; qVar1 = qVar1 + -0x100) {
    getentropy(buffer,0x100);
    buffer = (void *)((long)buffer + 0x100);
  }
  getentropy(buffer,qVar1);
  return count;
}

Assistant:

static qsizetype fillBuffer(void *buffer, qsizetype count) noexcept
    {
        // getentropy can read at most 256 bytes, so break the reading
        qsizetype read = 0;
        while (count - read > 256) {
            // getentropy can't fail under normal circumstances
            int ret = getentropy(reinterpret_cast<uchar *>(buffer) + read, 256);
            Q_ASSERT(ret == 0);
            Q_UNUSED(ret);
            read += 256;
        }

        int ret = getentropy(reinterpret_cast<uchar *>(buffer) + read, count - read);
        Q_ASSERT(ret == 0);
        Q_UNUSED(ret);
        return count;
    }